

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymesh_info.cpp
# Opt level: O2

ostream * CMU462::Collada::operator<<(ostream *os,PolymeshInfo *polymesh)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"PolymeshInfo: ");
  poVar1 = std::operator<<(poVar1,(string *)&(polymesh->super_Instance).name);
  poVar1 = std::operator<<(poVar1," (id:");
  poVar1 = std::operator<<(poVar1,(string *)&(polymesh->super_Instance).id);
  std::operator<<(poVar1,")");
  std::operator<<(os," [");
  poVar1 = std::operator<<(os," num_polygons=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(os," num_vertices=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(os," num_normals=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(os," num_texcoords=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(os," ]");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const PolymeshInfo& polymesh) {
  os << "PolymeshInfo: " << polymesh.name << " (id:" << polymesh.id << ")";

  os << " [";

  os << " num_polygons=" << polymesh.polygons.size();
  os << " num_vertices=" << polymesh.vertices.size();
  os << " num_normals=" << polymesh.normals.size();
  os << " num_texcoords=" << polymesh.texcoords.size();

  os << " ]";

  return os;
}